

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

bool __thiscall
DependencyScan::RecomputeDirty
          (DependencyScan *this,Node *initial_node,
          vector<Node_*,_std::allocator<Node_*>_> *validation_nodes,string *err)

{
  Node *node;
  _Elt_pointer ppNVar1;
  _Elt_pointer ppNVar2;
  bool bVar3;
  vector<Node_*,_std::allocator<Node_*>_> new_validation_nodes;
  vector<Node_*,_std::allocator<Node_*>_> stack;
  Node *initial_node_local;
  deque<Node_*,_std::allocator<Node_*>_> nodes;
  const_iterator local_78;
  iterator local_50;
  
  stack.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  stack.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  stack.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  new_validation_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_validation_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  new_validation_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  initial_node_local = initial_node;
  std::deque<Node_*,_std::allocator<Node_*>_>::deque
            (&nodes,1,&initial_node_local,(allocator_type *)&local_50);
  while( true ) {
    ppNVar2 = nodes.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    ppNVar1 = nodes.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    if (nodes.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_cur ==
        nodes.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
        _M_start._M_cur) break;
    node = *nodes.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
            _M_start._M_cur;
    std::deque<Node_*,_std::allocator<Node_*>_>::pop_front(&nodes);
    if (stack.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        stack.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      stack.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = stack.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    if (new_validation_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        new_validation_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      new_validation_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           new_validation_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    bVar3 = RecomputeNodeDirty(this,node,&stack,&new_validation_nodes,err);
    if (!bVar3) break;
    local_78._M_cur =
         nodes.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
         _M_finish._M_cur;
    local_78._M_first =
         nodes.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
         _M_finish._M_first;
    local_78._M_last =
         nodes.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
         _M_finish._M_last;
    local_78._M_node =
         nodes.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
         _M_finish._M_node;
    std::deque<Node*,std::allocator<Node*>>::
    insert<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,void>
              (&local_50,(deque<Node*,std::allocator<Node*>> *)&nodes,&local_78,
               (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>)
               new_validation_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>)
               new_validation_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    if (new_validation_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        new_validation_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if (validation_nodes == (vector<Node_*,_std::allocator<Node_*>_> *)0x0) {
        __assert_fail("validation_nodes && \"validations require RecomputeDirty to be called with validation_nodes\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph.cc"
                      ,0x49,
                      "bool DependencyScan::RecomputeDirty(Node *, std::vector<Node *> *, string *)"
                     );
      }
      std::vector<Node*,std::allocator<Node*>>::
      insert<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,void>
                ((vector<Node*,std::allocator<Node*>> *)validation_nodes,
                 (const_iterator)
                 (validation_nodes->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>)
                 new_validation_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>)
                 new_validation_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
  }
  std::_Deque_base<Node_*,_std::allocator<Node_*>_>::~_Deque_base
            (&nodes.super__Deque_base<Node_*,_std::allocator<Node_*>_>);
  std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
            (&new_validation_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>);
  std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
            (&stack.super__Vector_base<Node_*,_std::allocator<Node_*>_>);
  return ppNVar2 == ppNVar1;
}

Assistant:

bool DependencyScan::RecomputeDirty(Node* initial_node,
                                    std::vector<Node*>* validation_nodes,
                                    string* err) {
  std::vector<Node*> stack;
  std::vector<Node*> new_validation_nodes;

  std::deque<Node*> nodes(1, initial_node);

  // RecomputeNodeDirty might return new validation nodes that need to be
  // checked for dirty state, keep a queue of nodes to visit.
  while (!nodes.empty()) {
    Node* node = nodes.front();
    nodes.pop_front();

    stack.clear();
    new_validation_nodes.clear();

    if (!RecomputeNodeDirty(node, &stack, &new_validation_nodes, err))
      return false;
    nodes.insert(nodes.end(), new_validation_nodes.begin(),
                              new_validation_nodes.end());
    if (!new_validation_nodes.empty()) {
      assert(validation_nodes &&
          "validations require RecomputeDirty to be called with validation_nodes");
      validation_nodes->insert(validation_nodes->end(),
                           new_validation_nodes.begin(),
                           new_validation_nodes.end());
    }
  }

  return true;
}